

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionModel::ArchiveOUT(ChCollisionModel *this,ChArchiveOut *marchive)

{
  ChNameValue<float> local_48;
  ChNameValue<float> local_30;
  
  ChArchiveOut::VersionWrite<chrono::collision::ChCollisionModel>(marchive);
  local_30._value = &this->model_envelope;
  local_30._name = "model_envelope";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->model_safe_margin;
  local_48._name = "model_safe_margin";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChCollisionModel::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChCollisionModel>();

    // serialize all member data:
    marchive << CHNVP(model_envelope);
    marchive << CHNVP(model_safe_margin);
}